

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3_result_value(sqlite3_context *pCtx,sqlite3_value *pValue)

{
  Mem *pTo;
  int iVar1;
  
  pTo = pCtx->pOut;
  sqlite3VdbeMemCopy(pTo,pValue);
  sqlite3VdbeChangeEncoding(pTo,(uint)pCtx->enc);
  iVar1 = sqlite3VdbeMemTooBig(pTo);
  if (iVar1 != 0) {
    sqlite3_result_error_toobig(pCtx);
    return;
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_result_value(sqlite3_context *pCtx, sqlite3_value *pValue){
  Mem *pOut;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 ) return;
  if( pValue==0 ){
    sqlite3_result_null(pCtx);
    return;
  }
#endif
  pOut = pCtx->pOut;
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
  sqlite3VdbeMemCopy(pOut, pValue);
  sqlite3VdbeChangeEncoding(pOut, pCtx->enc);
  if( sqlite3VdbeMemTooBig(pOut) ){
    sqlite3_result_error_toobig(pCtx);
  }
}